

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall
HighsHashTable<unsigned_long,_void>::HighsHashTable(HighsHashTable<unsigned_long,_void> *this)

{
  unique_ptr<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
  *in_RDI;
  HighsHashTable<unsigned_long,_void> *unaff_retaddr;
  unique_ptr<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
  *capacity;
  
  capacity = in_RDI;
  std::
  unique_ptr<HighsHashTableEntry<unsigned_long,void>,HighsHashTable<unsigned_long,void>::OpNewDeleter>
  ::unique_ptr<HighsHashTable<unsigned_long,void>::OpNewDeleter,void>(in_RDI);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  in_RDI[4]._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_false>._M_head_impl =
       (HighsHashTableEntry<unsigned_long,_void> *)0x0;
  makeEmptyTable(unaff_retaddr,(u64)capacity);
  return;
}

Assistant:

HighsHashTable() { makeEmptyTable(128); }